

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  RTCIntersectArguments *pRVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 (*pauVar34) [16];
  undefined4 uVar35;
  undefined1 (*pauVar36) [16];
  AABBNodeMB4D *node1;
  ulong uVar38;
  int *piVar39;
  RTCRayQueryContext *pRVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  float fVar57;
  undefined1 auVar55 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  float fVar103;
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar105 [64];
  undefined1 auVar110 [16];
  uint uVar112;
  uint uVar113;
  uint uVar114;
  undefined1 auVar111 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  float fVar118;
  float fVar124;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar121 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1198 [28];
  int local_117c;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  RTCFilterFunctionNArguments local_1120;
  long local_10f0;
  undefined4 local_10e8;
  undefined4 local_10e4;
  undefined4 local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1058 [16];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar37;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar36 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    auVar72 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    fVar48 = (ray->super_RayK<1>).tfar;
    auVar71 = ZEXT464((uint)fVar48);
    auVar84._8_4_ = 0x7fffffff;
    auVar84._0_8_ = 0x7fffffff7fffffff;
    auVar84._12_4_ = 0x7fffffff;
    auVar84 = vandps_avx((undefined1  [16])aVar3,auVar84);
    auVar93._8_4_ = 0x219392ef;
    auVar93._0_8_ = 0x219392ef219392ef;
    auVar93._12_4_ = 0x219392ef;
    auVar84 = vcmpps_avx(auVar84,auVar93,1);
    auVar84 = vblendvps_avx((undefined1  [16])aVar3,auVar93,auVar84);
    auVar93 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar48));
    auVar98 = vrcpps_avx(auVar84);
    fVar48 = auVar98._0_4_;
    auVar86._0_4_ = auVar84._0_4_ * fVar48;
    fVar56 = auVar98._4_4_;
    auVar86._4_4_ = auVar84._4_4_ * fVar56;
    fVar57 = auVar98._8_4_;
    auVar86._8_4_ = auVar84._8_4_ * fVar57;
    fVar58 = auVar98._12_4_;
    auVar86._12_4_ = auVar84._12_4_ * fVar58;
    auVar98._8_4_ = 0x3f800000;
    auVar98._0_8_ = 0x3f8000003f800000;
    auVar98._12_4_ = 0x3f800000;
    auVar84 = vsubps_avx(auVar98,auVar86);
    auVar87._0_4_ = fVar48 + fVar48 * auVar84._0_4_;
    auVar87._4_4_ = fVar56 + fVar56 * auVar84._4_4_;
    auVar87._8_4_ = fVar57 + fVar57 * auVar84._8_4_;
    auVar87._12_4_ = fVar58 + fVar58 * auVar84._12_4_;
    uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_f88._4_4_ = uVar35;
    local_f88._0_4_ = uVar35;
    local_f88._8_4_ = uVar35;
    local_f88._12_4_ = uVar35;
    auVar102 = ZEXT1664(local_f88);
    uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_f98._4_4_ = uVar35;
    local_f98._0_4_ = uVar35;
    local_f98._8_4_ = uVar35;
    local_f98._12_4_ = uVar35;
    auVar105 = ZEXT1664(local_f98);
    uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_fa8._4_4_ = uVar35;
    local_fa8._0_4_ = uVar35;
    local_fa8._8_4_ = uVar35;
    local_fa8._12_4_ = uVar35;
    auVar111 = ZEXT1664(local_fa8);
    local_fb8 = vshufps_avx(auVar87,auVar87,0);
    auVar116 = ZEXT1664(local_fb8);
    auVar84 = vmovshdup_avx(auVar87);
    local_fc8 = vshufps_avx(auVar87,auVar87,0x55);
    auVar117 = ZEXT1664(local_fc8);
    auVar98 = vshufpd_avx(auVar87,auVar87,1);
    uVar46 = (ulong)(auVar87._0_4_ < 0.0) * 0x10;
    uVar41 = (ulong)(auVar84._0_4_ < 0.0) << 4 | 0x20;
    local_fd8 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar121 = ZEXT1664(local_fd8);
    uVar47 = (ulong)(auVar98._0_4_ < 0.0) << 4 | 0x40;
    local_fe8 = vshufps_avx(auVar72,auVar72,0);
    auVar127 = ZEXT1664(local_fe8);
    auVar84 = vshufps_avx(auVar93,auVar93,0);
    auVar55 = ZEXT1664(auVar84);
    local_10b8 = mm_lookupmask_ps._240_8_;
    uStack_10b0 = mm_lookupmask_ps._248_8_;
LAB_011d8c63:
    do {
      pauVar34 = pauVar36 + -1;
      pauVar36 = pauVar36 + -1;
      if (*(float *)(*pauVar34 + 8) <= auVar71._0_4_) {
        uVar42 = *(ulong *)*pauVar36;
        while ((uVar42 & 8) == 0) {
          uVar38 = uVar42 & 0xfffffffffffffff0;
          fVar48 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar59._4_4_ = fVar48;
          auVar59._0_4_ = fVar48;
          auVar59._8_4_ = fVar48;
          auVar59._12_4_ = fVar48;
          pfVar2 = (float *)(uVar38 + 0x80 + uVar46);
          pfVar1 = (float *)(uVar38 + 0x20 + uVar46);
          auVar72._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar72._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
          auVar72._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
          auVar72._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
          auVar84 = vsubps_avx(auVar72,auVar102._0_16_);
          auVar73._0_4_ = auVar116._0_4_ * auVar84._0_4_;
          auVar73._4_4_ = auVar116._4_4_ * auVar84._4_4_;
          auVar73._8_4_ = auVar116._8_4_ * auVar84._8_4_;
          auVar73._12_4_ = auVar116._12_4_ * auVar84._12_4_;
          pfVar2 = (float *)(uVar38 + 0x80 + uVar41);
          auVar84 = vmaxps_avx(auVar127._0_16_,auVar73);
          pfVar1 = (float *)(uVar38 + 0x20 + uVar41);
          auVar81._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar81._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
          auVar81._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
          auVar81._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
          auVar72 = vsubps_avx(auVar81,auVar105._0_16_);
          pfVar2 = (float *)(uVar38 + 0x80 + uVar47);
          pfVar1 = (float *)(uVar38 + 0x20 + uVar47);
          auVar88._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar88._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
          auVar88._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
          auVar88._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
          auVar82._0_4_ = auVar117._0_4_ * auVar72._0_4_;
          auVar82._4_4_ = auVar117._4_4_ * auVar72._4_4_;
          auVar82._8_4_ = auVar117._8_4_ * auVar72._8_4_;
          auVar82._12_4_ = auVar117._12_4_ * auVar72._12_4_;
          auVar72 = vsubps_avx(auVar88,auVar111._0_16_);
          auVar89._0_4_ = auVar121._0_4_ * auVar72._0_4_;
          auVar89._4_4_ = auVar121._4_4_ * auVar72._4_4_;
          auVar89._8_4_ = auVar121._8_4_ * auVar72._8_4_;
          auVar89._12_4_ = auVar121._12_4_ * auVar72._12_4_;
          auVar72 = vmaxps_avx(auVar82,auVar89);
          pfVar2 = (float *)(uVar38 + 0x80 + (uVar46 ^ 0x10));
          pfVar1 = (float *)(uVar38 + 0x20 + (uVar46 ^ 0x10));
          auVar90._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar90._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
          auVar90._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
          auVar90._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
          local_10a8 = vmaxps_avx(auVar84,auVar72);
          auVar84 = vsubps_avx(auVar90,auVar102._0_16_);
          pfVar2 = (float *)(uVar38 + 0x80 + (uVar41 ^ 0x10));
          auVar83._0_4_ = auVar116._0_4_ * auVar84._0_4_;
          auVar83._4_4_ = auVar116._4_4_ * auVar84._4_4_;
          auVar83._8_4_ = auVar116._8_4_ * auVar84._8_4_;
          auVar83._12_4_ = auVar116._12_4_ * auVar84._12_4_;
          pfVar1 = (float *)(uVar38 + 0x20 + (uVar41 ^ 0x10));
          auVar91._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar91._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
          auVar91._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
          auVar91._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
          auVar84 = vsubps_avx(auVar91,auVar105._0_16_);
          pfVar2 = (float *)(uVar38 + 0x80 + (uVar47 ^ 0x10));
          pfVar1 = (float *)(uVar38 + 0x20 + (uVar47 ^ 0x10));
          auVar94._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar94._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
          auVar94._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
          auVar94._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
          auVar92._0_4_ = auVar117._0_4_ * auVar84._0_4_;
          auVar92._4_4_ = auVar117._4_4_ * auVar84._4_4_;
          auVar92._8_4_ = auVar117._8_4_ * auVar84._8_4_;
          auVar92._12_4_ = auVar117._12_4_ * auVar84._12_4_;
          auVar84 = vsubps_avx(auVar94,auVar111._0_16_);
          auVar95._0_4_ = auVar121._0_4_ * auVar84._0_4_;
          auVar95._4_4_ = auVar121._4_4_ * auVar84._4_4_;
          auVar95._8_4_ = auVar121._8_4_ * auVar84._8_4_;
          auVar95._12_4_ = auVar121._12_4_ * auVar84._12_4_;
          auVar84 = vminps_avx(auVar92,auVar95);
          auVar72 = vminps_avx(auVar55._0_16_,auVar83);
          auVar84 = vminps_avx(auVar72,auVar84);
          auVar84 = vcmpps_avx(local_10a8,auVar84,2);
          if (((uint)uVar42 & 7) == 6) {
            auVar72 = vcmpps_avx(*(undefined1 (*) [16])(uVar38 + 0xe0),auVar59,2);
            auVar93 = vcmpps_avx(auVar59,*(undefined1 (*) [16])(uVar38 + 0xf0),1);
            auVar72 = vandps_avx(auVar72,auVar93);
            auVar84 = vandps_avx(auVar72,auVar84);
          }
          auVar84 = vpslld_avx(auVar84,0x1f);
          uVar43 = vmovmskps_avx(auVar84);
          if (uVar43 == 0) {
            auVar84 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar71 = ZEXT1664(auVar84);
            if (pauVar36 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_011d8c63;
          }
          uVar43 = uVar43 & 0xff;
          lVar45 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
            }
          }
          uVar42 = *(ulong *)(uVar38 + lVar45 * 8);
          uVar43 = uVar43 - 1 & uVar43;
          if (uVar43 != 0) {
            uVar112 = *(uint *)(local_10a8 + lVar45 * 4);
            lVar45 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
            uVar37 = *(ulong *)(uVar38 + lVar45 * 8);
            uVar113 = *(uint *)(local_10a8 + lVar45 * 4);
            uVar43 = uVar43 - 1 & uVar43;
            if (uVar43 == 0) {
              if (uVar112 < uVar113) {
                *(ulong *)*pauVar36 = uVar37;
                *(uint *)(*pauVar36 + 8) = uVar113;
                pauVar36 = pauVar36 + 1;
              }
              else {
                *(ulong *)*pauVar36 = uVar42;
                *(uint *)(*pauVar36 + 8) = uVar112;
                pauVar36 = pauVar36 + 1;
                uVar42 = uVar37;
              }
            }
            else {
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar42;
              auVar84 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar112));
              auVar74._8_8_ = 0;
              auVar74._0_8_ = uVar37;
              auVar72 = vpunpcklqdq_avx(auVar74,ZEXT416(uVar113));
              lVar45 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                }
              }
              auVar85._8_8_ = 0;
              auVar85._0_8_ = *(ulong *)(uVar38 + lVar45 * 8);
              auVar98 = vpunpcklqdq_avx(auVar85,ZEXT416(*(uint *)(local_10a8 + lVar45 * 4)));
              auVar93 = vpcmpgtd_avx(auVar72,auVar84);
              uVar43 = uVar43 - 1 & uVar43;
              if (uVar43 == 0) {
                auVar86 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar72,auVar84,auVar86);
                auVar84 = vblendvps_avx(auVar84,auVar72,auVar86);
                auVar72 = vpcmpgtd_avx(auVar98,auVar93);
                auVar86 = vpshufd_avx(auVar72,0xaa);
                auVar72 = vblendvps_avx(auVar98,auVar93,auVar86);
                auVar93 = vblendvps_avx(auVar93,auVar98,auVar86);
                auVar98 = vpcmpgtd_avx(auVar93,auVar84);
                auVar86 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar93,auVar84,auVar86);
                auVar84 = vblendvps_avx(auVar84,auVar93,auVar86);
                *pauVar36 = auVar84;
                pauVar36[1] = auVar98;
                uVar42 = auVar72._0_8_;
                pauVar36 = pauVar36 + 2;
              }
              else {
                lVar45 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                  }
                }
                auVar96._8_8_ = 0;
                auVar96._0_8_ = *(ulong *)(uVar38 + lVar45 * 8);
                auVar87 = vpunpcklqdq_avx(auVar96,ZEXT416(*(uint *)(local_10a8 + lVar45 * 4)));
                auVar86 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar72,auVar84,auVar86);
                auVar84 = vblendvps_avx(auVar84,auVar72,auVar86);
                auVar72 = vpcmpgtd_avx(auVar87,auVar98);
                auVar86 = vpshufd_avx(auVar72,0xaa);
                auVar72 = vblendvps_avx(auVar87,auVar98,auVar86);
                auVar98 = vblendvps_avx(auVar98,auVar87,auVar86);
                auVar86 = vpcmpgtd_avx(auVar98,auVar84);
                auVar87 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar98,auVar84,auVar87);
                auVar84 = vblendvps_avx(auVar84,auVar98,auVar87);
                auVar98 = vpcmpgtd_avx(auVar72,auVar93);
                auVar87 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar72,auVar93,auVar87);
                auVar72 = vblendvps_avx(auVar93,auVar72,auVar87);
                auVar93 = vpcmpgtd_avx(auVar86,auVar72);
                auVar87 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar86,auVar72,auVar87);
                auVar72 = vblendvps_avx(auVar72,auVar86,auVar87);
                *pauVar36 = auVar84;
                pauVar36[1] = auVar72;
                pauVar36[2] = auVar93;
                uVar42 = auVar98._0_8_;
                pauVar36 = pauVar36 + 3;
              }
            }
          }
        }
        uVar38 = (ulong)((uint)uVar42 & 0xf);
        if (uVar38 != 8) {
          uVar42 = uVar42 & 0xfffffffffffffff0;
          lVar45 = 0;
          do {
            lVar44 = lVar45 * 0x140;
            fVar48 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar2 = (float *)(uVar42 + 0x90 + lVar44);
            pfVar1 = (float *)(uVar42 + lVar44);
            auVar97._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar97._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar97._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar97._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0xa0 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x10 + lVar44);
            auVar99._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar99._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar99._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar99._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0xb0 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x20 + lVar44);
            auVar100._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar100._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar100._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar100._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0xc0 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x30 + lVar44);
            auVar61._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar61._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar61._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar61._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0xd0 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x40 + lVar44);
            auVar75._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar75._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar75._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar75._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0xe0 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x50 + lVar44);
            auVar104._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar104._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar104._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar104._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0xf0 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x60 + lVar44);
            auVar110._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar110._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar110._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar110._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar42 + 0x100 + lVar44);
            pfVar1 = (float *)(uVar42 + 0x70 + lVar44);
            auVar115._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar115._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar115._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar115._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar42 + 0x110 + lVar44);
            pfVar2 = (float *)(uVar42 + 0x80 + lVar44);
            auVar49._0_4_ = fVar48 * *pfVar1 + *pfVar2;
            auVar49._4_4_ = fVar48 * pfVar1[1] + pfVar2[1];
            auVar49._8_4_ = fVar48 * pfVar1[2] + pfVar2[2];
            auVar49._12_4_ = fVar48 * pfVar1[3] + pfVar2[3];
            local_1178 = vsubps_avx(auVar97,auVar61);
            auVar93 = vsubps_avx(auVar99,auVar75);
            auVar84 = vsubps_avx(auVar100,auVar104);
            auVar72 = vsubps_avx(auVar110,auVar97);
            auVar98 = vsubps_avx(auVar115,auVar99);
            auVar86 = vsubps_avx(auVar49,auVar100);
            fVar58 = auVar86._0_4_;
            fVar118 = auVar93._0_4_;
            auVar50._0_4_ = fVar118 * fVar58;
            fVar11 = auVar86._4_4_;
            fVar122 = auVar93._4_4_;
            auVar50._4_4_ = fVar122 * fVar11;
            fVar18 = auVar86._8_4_;
            fVar123 = auVar93._8_4_;
            auVar50._8_4_ = fVar123 * fVar18;
            fVar25 = auVar86._12_4_;
            fVar124 = auVar93._12_4_;
            auVar50._12_4_ = fVar124 * fVar25;
            fVar109 = auVar98._0_4_;
            fVar103 = auVar84._0_4_;
            auVar62._0_4_ = fVar103 * fVar109;
            fVar12 = auVar98._4_4_;
            fVar106 = auVar84._4_4_;
            auVar62._4_4_ = fVar106 * fVar12;
            fVar19 = auVar98._8_4_;
            fVar107 = auVar84._8_4_;
            auVar62._8_4_ = fVar107 * fVar19;
            fVar26 = auVar98._12_4_;
            fVar108 = auVar84._12_4_;
            auVar62._12_4_ = fVar108 * fVar26;
            local_1018 = vsubps_avx(auVar62,auVar50);
            fVar6 = auVar72._0_4_;
            auVar63._0_4_ = fVar103 * fVar6;
            fVar13 = auVar72._4_4_;
            auVar63._4_4_ = fVar106 * fVar13;
            fVar20 = auVar72._8_4_;
            auVar63._8_4_ = fVar107 * fVar20;
            fVar27 = auVar72._12_4_;
            auVar63._12_4_ = fVar108 * fVar27;
            fVar7 = local_1178._0_4_;
            auVar76._0_4_ = fVar58 * fVar7;
            fVar14 = local_1178._4_4_;
            auVar76._4_4_ = fVar11 * fVar14;
            fVar21 = local_1178._8_4_;
            auVar76._8_4_ = fVar18 * fVar21;
            fVar28 = local_1178._12_4_;
            auVar76._12_4_ = fVar25 * fVar28;
            local_1008 = vsubps_avx(auVar76,auVar63);
            auVar77._0_4_ = fVar109 * fVar7;
            auVar77._4_4_ = fVar12 * fVar14;
            auVar77._8_4_ = fVar19 * fVar21;
            auVar77._12_4_ = fVar26 * fVar28;
            auVar119._0_4_ = fVar118 * fVar6;
            auVar119._4_4_ = fVar122 * fVar13;
            auVar119._8_4_ = fVar123 * fVar20;
            auVar119._12_4_ = fVar124 * fVar27;
            local_1138 = vsubps_avx(auVar119,auVar77);
            uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar120._4_4_ = uVar35;
            auVar120._0_4_ = uVar35;
            auVar120._8_4_ = uVar35;
            auVar120._12_4_ = uVar35;
            uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar125._4_4_ = uVar35;
            auVar125._0_4_ = uVar35;
            auVar125._8_4_ = uVar35;
            auVar125._12_4_ = uVar35;
            uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar128._4_4_ = uVar35;
            auVar128._0_4_ = uVar35;
            auVar128._8_4_ = uVar35;
            auVar128._12_4_ = uVar35;
            fVar48 = (ray->super_RayK<1>).dir.field_0.m128[1];
            auVar84 = vsubps_avx(auVar97,auVar120);
            fVar56 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar72 = vsubps_avx(auVar99,auVar125);
            auVar98 = vsubps_avx(auVar100,auVar128);
            fVar8 = auVar98._0_4_;
            auVar126._0_4_ = fVar48 * fVar8;
            fVar15 = auVar98._4_4_;
            auVar126._4_4_ = fVar48 * fVar15;
            fVar22 = auVar98._8_4_;
            auVar126._8_4_ = fVar48 * fVar22;
            fVar29 = auVar98._12_4_;
            auVar126._12_4_ = fVar48 * fVar29;
            fVar9 = auVar72._0_4_;
            auVar129._0_4_ = fVar56 * fVar9;
            fVar16 = auVar72._4_4_;
            auVar129._4_4_ = fVar56 * fVar16;
            fVar23 = auVar72._8_4_;
            auVar129._8_4_ = fVar56 * fVar23;
            fVar30 = auVar72._12_4_;
            auVar129._12_4_ = fVar56 * fVar30;
            auVar72 = vsubps_avx(auVar129,auVar126);
            fVar57 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar10 = auVar84._0_4_;
            auVar51._0_4_ = fVar56 * fVar10;
            fVar17 = auVar84._4_4_;
            auVar51._4_4_ = fVar56 * fVar17;
            fVar24 = auVar84._8_4_;
            auVar51._8_4_ = fVar56 * fVar24;
            fVar31 = auVar84._12_4_;
            auVar51._12_4_ = fVar56 * fVar31;
            auVar64._0_4_ = fVar57 * fVar8;
            auVar64._4_4_ = fVar57 * fVar15;
            auVar64._8_4_ = fVar57 * fVar22;
            auVar64._12_4_ = fVar57 * fVar29;
            auVar98 = vsubps_avx(auVar64,auVar51);
            auVar65._0_4_ = fVar57 * fVar9;
            auVar65._4_4_ = fVar57 * fVar16;
            auVar65._8_4_ = fVar57 * fVar23;
            auVar65._12_4_ = fVar57 * fVar30;
            auVar78._0_4_ = fVar48 * fVar10;
            auVar78._4_4_ = fVar48 * fVar17;
            auVar78._8_4_ = fVar48 * fVar24;
            auVar78._12_4_ = fVar48 * fVar31;
            auVar86 = vsubps_avx(auVar78,auVar65);
            auVar79._0_4_ =
                 fVar57 * local_1018._0_4_ + fVar48 * local_1008._0_4_ + fVar56 * local_1138._0_4_;
            auVar79._4_4_ =
                 fVar57 * local_1018._4_4_ + fVar48 * local_1008._4_4_ + fVar56 * local_1138._4_4_;
            auVar79._8_4_ =
                 fVar57 * local_1018._8_4_ + fVar48 * local_1008._8_4_ + fVar56 * local_1138._8_4_;
            auVar79._12_4_ =
                 fVar57 * local_1018._12_4_ +
                 fVar48 * local_1008._12_4_ + fVar56 * local_1138._12_4_;
            auVar66._8_8_ = 0x8000000080000000;
            auVar66._0_8_ = 0x8000000080000000;
            auVar84 = vandps_avx(auVar79,auVar66);
            uVar43 = auVar84._0_4_;
            local_10a8._0_4_ =
                 (float)(uVar43 ^ (uint)(fVar6 * auVar72._0_4_ +
                                        fVar109 * auVar98._0_4_ + fVar58 * auVar86._0_4_));
            uVar112 = auVar84._4_4_;
            local_10a8._4_4_ =
                 (float)(uVar112 ^
                        (uint)(fVar13 * auVar72._4_4_ +
                              fVar12 * auVar98._4_4_ + fVar11 * auVar86._4_4_));
            uVar113 = auVar84._8_4_;
            local_10a8._8_4_ =
                 (float)(uVar113 ^
                        (uint)(fVar20 * auVar72._8_4_ +
                              fVar19 * auVar98._8_4_ + fVar18 * auVar86._8_4_));
            uVar114 = auVar84._12_4_;
            local_10a8._12_4_ =
                 (float)(uVar114 ^
                        (uint)(fVar27 * auVar72._12_4_ +
                              fVar26 * auVar98._12_4_ + fVar25 * auVar86._12_4_));
            local_1098._0_4_ =
                 (float)(uVar43 ^ (uint)(auVar72._0_4_ * fVar7 +
                                        auVar98._0_4_ * fVar118 + fVar103 * auVar86._0_4_));
            local_1098._4_4_ =
                 (float)(uVar112 ^
                        (uint)(auVar72._4_4_ * fVar14 +
                              auVar98._4_4_ * fVar122 + fVar106 * auVar86._4_4_));
            local_1098._8_4_ =
                 (float)(uVar113 ^
                        (uint)(auVar72._8_4_ * fVar21 +
                              auVar98._8_4_ * fVar123 + fVar107 * auVar86._8_4_));
            local_1098._12_4_ =
                 (float)(uVar114 ^
                        (uint)(auVar72._12_4_ * fVar28 +
                              auVar98._12_4_ * fVar124 + fVar108 * auVar86._12_4_));
            auVar98 = ZEXT416(0) << 0x20;
            auVar84 = vcmpps_avx(local_10a8,auVar98,5);
            auVar72 = vcmpps_avx(local_1098,auVar98,5);
            auVar84 = vandps_avx(auVar84,auVar72);
            auVar67._8_4_ = 0x7fffffff;
            auVar67._0_8_ = 0x7fffffff7fffffff;
            auVar67._12_4_ = 0x7fffffff;
            local_1078 = vandps_avx(auVar79,auVar67);
            auVar72 = vcmpps_avx(auVar98,auVar79,4);
            auVar84 = vandps_avx(auVar84,auVar72);
            auVar68._0_4_ = local_10a8._0_4_ + local_1098._0_4_;
            auVar68._4_4_ = local_10a8._4_4_ + local_1098._4_4_;
            auVar68._8_4_ = local_10a8._8_4_ + local_1098._8_4_;
            auVar68._12_4_ = local_10a8._12_4_ + local_1098._12_4_;
            auVar72 = vcmpps_avx(auVar68,local_1078,2);
            auVar84 = vandps_avx(auVar84,auVar72);
            auVar32._8_8_ = uStack_10b0;
            auVar32._0_8_ = local_10b8;
            auVar32 = auVar32 & auVar84;
            if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar32[0xf] < '\0') {
              auVar33._8_8_ = uStack_10b0;
              auVar33._0_8_ = local_10b8;
              auVar84 = vandps_avx(auVar84,auVar33);
              local_1088._0_4_ =
                   (float)(uVar43 ^ (uint)(local_1018._0_4_ * fVar10 +
                                          local_1008._0_4_ * fVar9 + fVar8 * local_1138._0_4_));
              local_1088._4_4_ =
                   (float)(uVar112 ^
                          (uint)(local_1018._4_4_ * fVar17 +
                                local_1008._4_4_ * fVar16 + fVar15 * local_1138._4_4_));
              local_1088._8_4_ =
                   (float)(uVar113 ^
                          (uint)(local_1018._8_4_ * fVar24 +
                                local_1008._8_4_ * fVar23 + fVar22 * local_1138._8_4_));
              local_1088._12_4_ =
                   (float)(uVar114 ^
                          (uint)(local_1018._12_4_ * fVar31 +
                                local_1008._12_4_ * fVar30 + fVar29 * local_1138._12_4_));
              fVar48 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar56 = local_1078._0_4_;
              auVar52._0_4_ = fVar56 * fVar48;
              fVar57 = local_1078._4_4_;
              auVar52._4_4_ = fVar57 * fVar48;
              fVar58 = local_1078._8_4_;
              auVar52._8_4_ = fVar58 * fVar48;
              fVar109 = local_1078._12_4_;
              auVar52._12_4_ = fVar109 * fVar48;
              auVar72 = vcmpps_avx(auVar52,local_1088,1);
              fVar48 = (ray->super_RayK<1>).tfar;
              auVar69._0_4_ = fVar56 * fVar48;
              auVar69._4_4_ = fVar57 * fVar48;
              auVar69._8_4_ = fVar58 * fVar48;
              auVar69._12_4_ = fVar109 * fVar48;
              auVar98 = vcmpps_avx(local_1088,auVar69,2);
              auVar72 = vandps_avx(auVar98,auVar72);
              auVar98 = auVar84 & auVar72;
              if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar98[0xf] < '\0') {
                auVar101._0_4_ = (ray->super_RayK<1>).tfar;
                auVar101._4_4_ = (ray->super_RayK<1>).mask;
                auVar101._8_4_ = (ray->super_RayK<1>).id;
                auVar101._12_4_ = (ray->super_RayK<1>).flags;
                auVar84 = vandps_avx(auVar84,auVar72);
                local_1058 = auVar84;
                local_ff8 = local_1138._0_8_;
                uStack_ff0 = local_1138._8_8_;
                local_1138._0_8_ = context->scene;
                local_1168 = auVar84;
                auVar72 = vrcpps_avx(local_1078);
                fVar48 = auVar72._0_4_;
                auVar70._0_4_ = fVar56 * fVar48;
                fVar56 = auVar72._4_4_;
                auVar70._4_4_ = fVar57 * fVar56;
                fVar57 = auVar72._8_4_;
                auVar70._8_4_ = fVar58 * fVar57;
                fVar58 = auVar72._12_4_;
                auVar70._12_4_ = fVar109 * fVar58;
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = 0x3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar72 = vsubps_avx(auVar80,auVar70);
                fVar48 = fVar48 + fVar48 * auVar72._0_4_;
                fVar56 = fVar56 + fVar56 * auVar72._4_4_;
                fVar57 = fVar57 + fVar57 * auVar72._8_4_;
                fVar58 = fVar58 + fVar58 * auVar72._12_4_;
                local_1148._0_4_ = fVar48 * local_1088._0_4_;
                local_1148._4_4_ = fVar56 * local_1088._4_4_;
                local_1148._8_4_ = fVar57 * local_1088._8_4_;
                local_1148._12_4_ = fVar58 * local_1088._12_4_;
                local_1028 = local_1148;
                local_1048[0] = fVar48 * local_10a8._0_4_;
                local_1048[1] = fVar56 * local_10a8._4_4_;
                local_1048[2] = fVar57 * local_10a8._8_4_;
                local_1048[3] = fVar58 * local_10a8._12_4_;
                local_1038[0] = fVar48 * local_1098._0_4_;
                local_1038[1] = fVar56 * local_1098._4_4_;
                local_1038[2] = fVar57 * local_1098._8_4_;
                local_1038[3] = fVar58 * local_1098._12_4_;
                auVar53._8_4_ = 0x7f800000;
                auVar53._0_8_ = 0x7f8000007f800000;
                auVar53._12_4_ = 0x7f800000;
                auVar72 = vblendvps_avx(auVar53,local_1148,auVar84);
                auVar98 = vshufps_avx(auVar72,auVar72,0xb1);
                auVar98 = vminps_avx(auVar98,auVar72);
                auVar86 = vshufpd_avx(auVar98,auVar98,1);
                auVar98 = vminps_avx(auVar86,auVar98);
                auVar72 = vcmpps_avx(auVar72,auVar98,0);
                auVar98 = auVar84 & auVar72;
                if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar98[0xf] < '\0') {
                  auVar84 = vandps_avx(auVar72,auVar84);
                }
                lVar44 = lVar44 + uVar42;
                local_1198._0_4_ = vextractps_avx(auVar101,1);
                local_1198._4_12_ = auVar93._4_12_;
                uVar35 = vmovmskps_avx(auVar84);
                uVar37 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar35);
                piVar39 = (int *)0x0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> (long)piVar39 & 1) == 0; piVar39 = (int *)((long)piVar39 + 1)) {
                  }
                }
                do {
                  local_1178._0_8_ = piVar39;
                  uVar43 = *(uint *)(lVar44 + 0x120 + (long)piVar39 * 4);
                  lVar4 = *(long *)(*(long *)(local_1138._0_8_ + 0x1e8) + (ulong)uVar43 * 8);
                  if ((*(uint *)(lVar4 + 0x34) & local_1198._0_4_) == 0) {
                    *(undefined4 *)(local_1168 + (long)piVar39 * 4) = 0;
                    uVar43 = local_1198._0_4_;
                  }
                  else {
                    pRVar5 = context->args;
                    local_1198._0_8_ = pRVar5;
                    if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                      pRVar40 = context->user;
                      if (*(long *)(lVar4 + 0x40) == 0) {
                        fVar48 = local_1048[(long)piVar39];
                        fVar56 = local_1038[(long)piVar39];
                        (ray->super_RayK<1>).tfar = *(float *)(local_1028 + (long)piVar39 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1018 + (long)piVar39 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1008 + (long)piVar39 * 4);
                        (ray->Ng).field_0.field_0.z =
                             *(float *)((long)&local_ff8 + (long)piVar39 * 4);
                        ray->u = fVar48;
                        ray->v = fVar56;
                        ray->primID = *(uint *)(lVar44 + 0x130 + (long)piVar39 * 4);
                        ray->geomID = uVar43;
                        ray->instID[0] = pRVar40->instID[0];
                        ray->instPrimID[0] = pRVar40->instPrimID[0];
                        break;
                      }
                      local_1158 = auVar101;
                    }
                    else {
                      local_1158 = auVar101;
                      pRVar40 = context->user;
                    }
                    local_10e8 = *(undefined4 *)(local_1018 + (long)piVar39 * 4);
                    local_10e4 = *(undefined4 *)(local_1008 + (long)piVar39 * 4);
                    local_10e0 = *(undefined4 *)((long)&local_ff8 + (long)piVar39 * 4);
                    local_10dc = local_1048[(long)piVar39];
                    local_10d8 = local_1038[(long)piVar39];
                    local_10d4 = *(undefined4 *)(lVar44 + 0x130 + (long)piVar39 * 4);
                    local_10d0 = uVar43;
                    local_10cc = pRVar40->instID[0];
                    local_10c8 = pRVar40->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1028 + (long)piVar39 * 4);
                    local_117c = -1;
                    local_1120.valid = &local_117c;
                    local_1120.geometryUserPtr = *(void **)(lVar4 + 0x18);
                    local_1120.context = pRVar40;
                    local_1120.ray = (RTCRayN *)ray;
                    local_1120.hit = (RTCHitN *)&local_10e8;
                    local_1120.N = 1;
                    local_10f0 = lVar4;
                    local_1158 = auVar101;
                    if (((*(code **)(lVar4 + 0x40) == (code *)0x0) ||
                        ((**(code **)(lVar4 + 0x40))(&local_1120), *local_1120.valid != 0)) &&
                       ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_10f0 + 0x3e) & 0x40) == 0)) ||
                         ((*pRVar5->filter)(&local_1120), *local_1120.valid != 0)))))) {
                      (((Vec3f *)((long)local_1120.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1120.hit;
                      (((Vec3f *)((long)local_1120.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1120.hit + 4);
                      (((Vec3f *)((long)local_1120.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1120.hit + 8);
                      *(float *)((long)local_1120.ray + 0x3c) = *(float *)(local_1120.hit + 0xc);
                      *(float *)((long)local_1120.ray + 0x40) = *(float *)(local_1120.hit + 0x10);
                      *(float *)((long)local_1120.ray + 0x44) = *(float *)(local_1120.hit + 0x14);
                      *(float *)((long)local_1120.ray + 0x48) = *(float *)(local_1120.hit + 0x18);
                      *(float *)((long)local_1120.ray + 0x4c) = *(float *)(local_1120.hit + 0x1c);
                      *(float *)((long)local_1120.ray + 0x50) = *(float *)(local_1120.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_1158._0_4_;
                    }
                    *(undefined4 *)(local_1168 + local_1178._0_8_ * 4) = 0;
                    fVar48 = (ray->super_RayK<1>).tfar;
                    auVar54._4_4_ = fVar48;
                    auVar54._0_4_ = fVar48;
                    auVar54._8_4_ = fVar48;
                    auVar54._12_4_ = fVar48;
                    auVar84 = vcmpps_avx(local_1148,auVar54,2);
                    local_1168 = vandps_avx(auVar84,local_1168);
                    auVar101._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar101._4_4_ = (ray->super_RayK<1>).mask;
                    auVar101._8_4_ = (ray->super_RayK<1>).id;
                    auVar101._12_4_ = (ray->super_RayK<1>).flags;
                    uVar43 = vextractps_avx(auVar101,1);
                  }
                  local_1198._0_4_ = uVar43;
                  local_1158 = auVar101;
                  if ((((local_1168 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1168 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1168 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1168[0xf]) break;
                  BVHNIntersector1<4,16777232,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_1120);
                  piVar39 = local_1120.valid;
                  auVar101 = local_1158;
                } while( true );
              }
            }
            lVar45 = lVar45 + 1;
          } while (lVar45 != uVar38 - 8);
        }
        fVar48 = (ray->super_RayK<1>).tfar;
        auVar55 = ZEXT1664(CONCAT412(fVar48,CONCAT48(fVar48,CONCAT44(fVar48,fVar48))));
        auVar71 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar102 = ZEXT1664(local_f88);
        auVar105 = ZEXT1664(local_f98);
        auVar111 = ZEXT1664(local_fa8);
        auVar116 = ZEXT1664(local_fb8);
        auVar117 = ZEXT1664(local_fc8);
        auVar121 = ZEXT1664(local_fd8);
        auVar127 = ZEXT1664(local_fe8);
      }
    } while (pauVar36 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }